

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_ws_handshake(lws *wsi)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uchar *value;
  uchar *__s;
  size_t sVar4;
  lws_http_mount *plVar5;
  int iVar6;
  ulong len;
  uint8_t *p;
  uint8_t buf [2064];
  uchar *local_840 [3];
  uchar local_828 [2047];
  uchar local_29;
  
  local_840[0] = local_828;
  iVar1 = lws_add_http_header_status(wsi,200,local_840,&local_29);
  iVar6 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
  if (0x40 < iVar1) {
    return -1;
  }
  if (((wsi->field_0x472 & 0x40) == 0) || (wsi->child_list == (lws *)0x0)) {
    iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
    if ((iVar1 == 0) ||
       ((__s = (uchar *)((wsi->a).protocol)->name, __s == (uchar *)0x0 ||
        (value = __s, *__s == '\0')))) goto LAB_00127732;
  }
  else {
    pcVar3 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
    if (pcVar3 == (char *)0x0) goto LAB_00127732;
    value = (uchar *)lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
    __s = (uchar *)lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
  }
  sVar4 = strlen((char *)__s);
  iVar1 = lws_add_http_header_by_token(wsi,WSI_TOKEN_PROTOCOL,value,(int)sVar4,local_840,&local_29);
  if (iVar1 != 0) {
    return -1;
  }
LAB_00127732:
  iVar1 = lws_finalize_http_header(wsi,local_840,&local_29);
  if (iVar1 == 0) {
    len = (long)local_840[0] - (long)local_828;
    uVar2 = lws_write(wsi,local_828,len,LWS_WRITE_HTTP_HEADERS);
    if (uVar2 == (uint)len) {
      lwsi_set_state(wsi,0x119);
      wsi->lws_rx_parse_state = '\0';
      pcVar3 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_COLON_PATH);
      iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH);
      plVar5 = lws_find_mount(wsi,pcVar3,iVar1);
      if (((plVar5 != (lws_http_mount *)0x0) &&
          (plVar5->cgienv != (lws_protocol_vhost_options *)0x0)) &&
         (iVar1 = (*((wsi->a).protocol)->callback)
                            (wsi,LWS_CALLBACK_HTTP_PMO,wsi->user_space,plVar5->cgienv,0), iVar1 != 0
         )) {
        return 1;
      }
      lws_validity_confirmed(wsi);
      iVar6 = 0;
    }
    else {
      _lws_log(1,"_write returned %d from %d\n",(ulong)uVar2,len & 0xffffffff);
    }
  }
  return iVar6;
}

Assistant:

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	size_t m;
	int n;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->a.protocol->name && wsi->a.protocol->name[0]) {

#if defined(LWS_WITH_SECURE_STREAMS) && defined(LWS_WITH_SERVER)

		/*
		 * This is the h2 version of server-ws.c understanding that it
		 * did the ws upgrade on a ss server object, therefore it needs
		 * to pass back to the peer the policy ws-protocol name, not
		 * the generic ss-ws.c protocol name
		 */

		if (wsi->a.vhost && wsi->a.vhost->ss_handle &&
		    wsi->a.vhost->ss_handle->policy->u.http.u.ws.subprotocol) {
			lws_ss_handle_t *h =
				(lws_ss_handle_t *)wsi->a.opaque_user_data;

			lwsl_notice("%s: Server SS %s .wsi %s switching to ws protocol\n",
					__func__, lws_ss_tag(h), lws_wsi_tag(h->wsi));

			wsi->a.protocol = &protocol_secstream_ws;

			/*
			 * inform the SS user code that this has done a one-way
			 * upgrade to some other protocol... it will likely
			 * want to treat subsequent payloads differently
			 */

			lws_ss_event_helper(h, LWSSSCS_SERVER_UPGRADE);

			lws_mux_mark_immortal(wsi);

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol,
				(int)strlen(wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol), &p, end))
					return -1;
		} else
#endif

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.protocol->name,
				(int)strlen(wsi->a.protocol->name), &p, end))
					return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff_size_t(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != (int)m) {
		lwsl_err("_write returned %d from %d\n", n, (int)m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->a.protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}